

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86CMP(uchar *stream,x86Reg reg1,x86Reg reg2)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  
  bVar2 = 8 < (int)reg1 | (8 < (int)reg2) << 2;
  bVar3 = bVar2 != 0;
  if (bVar3) {
    *stream = bVar2 | 0x40;
  }
  stream[bVar3] = '9';
  uVar1 = encodeRegister(reg1,regCode[reg2]);
  stream[(ulong)bVar3 + 1] = uVar1;
  return bVar3 + 2;
}

Assistant:

int x86CMP(unsigned char *stream, x86Reg reg1, x86Reg reg2)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, reg1, reg2);
	*stream++ = 0x39;
	*stream++ = encodeRegister(reg1, regCode[reg2]);

	return int(stream - start);
}